

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

Expression * slang::ast::IntegerLiteral::fromConstant(Compilation *compilation,SVInt *value)

{
  IntegerLiteral *pIVar1;
  bool local_21;
  SVInt val;
  
  SVInt::resize(&val,(bitwidth_t)value);
  val.super_SVIntStorage.signFlag = true;
  local_21 = true;
  pIVar1 = BumpAllocator::
           emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange_const&>
                     (&compilation->super_BumpAllocator,compilation,compilation->intType,&val,
                      &local_21,(SourceRange *)&SourceRange::NoLocation);
  SVInt::~SVInt(&val);
  return &pIVar1->super_Expression;
}

Assistant:

Expression& IntegerLiteral::fromConstant(Compilation& compilation, const SVInt& value) {
    SVInt val = value.resize(32);
    val.setSigned(true);

    return *compilation.emplace<IntegerLiteral>(compilation, compilation.getIntType(),
                                                std::move(val), true, SourceRange::NoLocation);
}